

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::savedashinput(Forth *this)

{
  undefined1 local_60 [8];
  structSavedInput save;
  Forth *this_local;
  
  save._72_8_ = this;
  requireDStackAvailable(this,2,"SAVE-INPUT");
  local_60._0_4_ = InterpretSource;
  save.interpretState_ = InterpretSource;
  save._4_4_ = 0;
  save.inputBufferStringsCurrent_._0_4_ = 0;
  save.inputBufferStringsCurrent_._4_4_ = 0;
  save.SourceBufferOffset_ = 0;
  save.SourceBufferAddress_ = 0;
  save.SourceBufferSize_ = 0;
  save.next_ = 0;
  save.SourceDashId_ = 0;
  save.InputBufferSourceSavedBy_ = fromFile;
  save._44_4_ = 0;
  save.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  save.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&save.InputBufferSourceSavedBy_);
  save.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  saveInput(this,(structSavedInput *)local_60,false);
  this->saveInputVectorLastSaved = this->saveInputVectorLastSaved + 1;
  save.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = this->saveInputVectorLastSaved;
  std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
  ::push_back(&this->savedInputVector,(value_type *)local_60);
  push(this,this->saveInputVectorLastSaved);
  push(this,1);
  structSavedInput::~structSavedInput((structSavedInput *)local_60);
  return;
}

Assistant:

void savedashinput() {
				REQUIRE_DSTACK_AVAILABLE(2, "SAVE-INPUT");
				struct structSavedInput save {};
				saveInput(save, false);
				++saveInputVectorLastSaved;
				save.saveId = saveInputVectorLastSaved;
				savedInputVector.push_back(save);
				push(saveInputVectorLastSaved);
				push(1);
		}